

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

avector<Vec3ff> * __thiscall
embree::XMLLoader::loadVec3ffArray
          (avector<Vec3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  size_t *psVar1;
  float *pfVar2;
  XML *this_00;
  pointer pTVar3;
  pointer pTVar4;
  int iVar5;
  Vec3fx *pVVar6;
  runtime_error *this_01;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  size_t *psVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  string local_98;
  string local_78;
  float local_58;
  float local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (Vec3fx *)0x0;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ofs","");
    XML::parm(&local_78,this_00,&local_98);
    iVar5 = std::__cxx11::string::compare((char *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (iVar5 == 0) {
      psVar1 = &__return_storage_ptr__->size_active;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (Vec3fx *)0x0;
      pTVar3 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar9 = (long)pTVar4 - (long)pTVar3 >> 3;
      uVar11 = lVar9 * -0x71c71c71c71c71c7;
      if ((uVar11 & 3) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_98,&xml->ptr->loc);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_78._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_78._M_dataplus._M_p == psVar8) {
          local_78.field_2._M_allocated_capacity = *psVar8;
          local_78.field_2._8_8_ = plVar7[3];
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar8;
        }
        local_78._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_78);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar11 = uVar11 >> 2;
      psVar10 = psVar1;
      if (pTVar4 != pTVar3) {
        pVVar6 = (Vec3fx *)alignedMalloc(lVar9 * 0x38e38e38e38e38e4,0x10);
        __return_storage_ptr__->items = pVVar6;
        alignedFree((void *)0x0);
        psVar10 = &__return_storage_ptr__->size_alloced;
        *psVar1 = uVar11;
      }
      *psVar10 = uVar11;
      if (*psVar1 != 0) {
        lVar12 = 0;
        lVar9 = 0;
        uVar11 = 0;
        do {
          fVar13 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ty +
                                         lVar9),true);
          local_48 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].ty +
                                           lVar9),true);
          local_58 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].ty +
                                           lVar9),true);
          fVar14 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[3].ty +
                                         lVar9),true);
          pfVar2 = (float *)((long)&__return_storage_ptr__->items->field_0 + lVar12);
          *pfVar2 = fVar13;
          pfVar2[1] = local_48;
          pfVar2[2] = local_58;
          pfVar2[3] = fVar14;
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x120;
          lVar12 = lVar12 + 0x10;
        } while (uVar11 < __return_storage_ptr__->size_active);
      }
    }
    else {
      loadBinary<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                (__return_storage_ptr__,this,xml);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3ff> XMLLoader::loadVec3ffArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3ff>();

    if (xml->parm("ofs") != "") {
      return loadBinary<avector<Vec3ff>>(xml);
    } 
    else 
    {
      avector<Vec3ff> data;
      if (xml->body.size() % 4 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float4> body");
      data.resize(xml->body.size()/4);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3ff(xml->body[4*i+0].Float(),xml->body[4*i+1].Float(),xml->body[4*i+2].Float(),xml->body[4*i+3].Float());
      return data;
    }
  }